

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

QModelIndex * __thiscall
TreeModel::findByBase(QModelIndex *__return_storage_ptr__,TreeModel *this,UINT32 base)

{
  bool bVar1;
  bool bVar2;
  QAbstractItemModel *pQVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  QModelIndex local_110;
  QModelIndex local_f8;
  QModelIndex local_e0;
  QByteArray local_c8;
  QByteArray local_b0;
  QByteArray local_88;
  int local_70;
  UINT32 local_6c;
  UINT32 fullSize;
  UINT32 currentBase;
  QModelIndex currentIndex;
  int i;
  int n;
  undefined1 local_30 [8];
  QModelIndex parentIndex;
  UINT32 base_local;
  TreeModel *this_local;
  
  parentIndex.m._4_4_ = base;
  QModelIndex::QModelIndex((QModelIndex *)&i);
  (**(code **)(*(long *)this + 0x60))(local_30,this,0,0,&i);
LAB_001c27bd:
  currentIndex.m._4_4_ = (**(code **)(*(long *)this + 0x78))(this,local_30);
  currentIndex.m._0_4_ = 0;
  do {
    if (currentIndex.m._4_4_ <= (int)currentIndex.m) {
      QModelIndex::QModelIndex(&local_110);
      (**(code **)(*(long *)this + 0x60))(&local_f8,this,0,0,&local_110);
      bVar1 = QModelIndex::operator==((QModelIndex *)local_30,&local_f8);
      if (bVar1) {
        QModelIndex::QModelIndex(__return_storage_ptr__);
      }
      else {
        __return_storage_ptr__->r = local_30._0_4_;
        __return_storage_ptr__->c = local_30._4_4_;
        __return_storage_ptr__->i = parentIndex._0_8_;
        __return_storage_ptr__->m = (QAbstractItemModel *)parentIndex.i;
      }
      return __return_storage_ptr__;
    }
    pQVar3 = QModelIndex::model((QModelIndex *)local_30);
    (**(code **)(*(long *)pQVar3 + 0x60))
              ((QModelIndex *)&fullSize,pQVar3,(int)currentIndex.m,0,(QModelIndex *)local_30);
    local_6c = TreeModel::base(this,(QModelIndex *)&fullSize);
    header(&local_88,this,(QModelIndex *)&fullSize);
    qVar4 = QByteArray::size(&local_88);
    body(&local_b0,this,(QModelIndex *)&fullSize);
    qVar5 = QByteArray::size(&local_b0);
    tail(&local_c8,this,(QModelIndex *)&fullSize);
    qVar6 = QByteArray::size(&local_c8);
    QByteArray::~QByteArray(&local_c8);
    QByteArray::~QByteArray(&local_b0);
    QByteArray::~QByteArray(&local_88);
    local_70 = (int)qVar4 + (int)qVar5 + (int)qVar6;
    bVar1 = compressed(this,(QModelIndex *)&fullSize);
    if (bVar1) {
      bVar2 = compressed(this,(QModelIndex *)&fullSize);
      bVar1 = false;
      if (bVar2) {
        QModelIndex::parent(&local_e0,(QModelIndex *)&fullSize);
        bVar2 = compressed(this,&local_e0);
        bVar1 = false;
        if (!bVar2) goto LAB_001c2986;
      }
    }
    else {
LAB_001c2986:
      bVar1 = false;
      if (local_6c <= parentIndex.m._4_4_) {
        bVar1 = parentIndex.m._4_4_ < local_6c + local_70;
      }
    }
    if (bVar1) break;
    currentIndex.m._0_4_ = (int)currentIndex.m + 1;
  } while( true );
  local_30._0_4_ = fullSize;
  local_30._4_4_ = currentBase;
  parentIndex.r = currentIndex.r;
  parentIndex.c = currentIndex.c;
  parentIndex.i = currentIndex.i;
  goto LAB_001c27bd;
}

Assistant:

UModelIndex TreeModel::findByBase(UINT32 base) const
{
    UModelIndex parentIndex = index(0,0);
    
goDeeper:
    int n = rowCount(parentIndex);
    for (int i = 0; i < n; i++) {
        UModelIndex currentIndex = parentIndex.model()->index(i, 0, parentIndex);
        
        UINT32 currentBase = this->base(currentIndex);
        UINT32 fullSize = (UINT32)(header(currentIndex).size() + body(currentIndex).size() + tail(currentIndex).size());
        if ((compressed(currentIndex) == false || (compressed(currentIndex) == true && compressed(currentIndex.parent()) == false)) // Base is meaningful only for true uncompressed items
            && currentBase <= base && base < currentBase + fullSize) { // Base must be in range [currentBase, currentBase + fullSize)
            // Found a better candidate
            parentIndex = currentIndex;
            goto goDeeper;
        }
    }
    
    return (parentIndex == index(0, 0) ? UModelIndex() : parentIndex);
}